

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O1

void EmitForIn(ParseNodeForInOrForOf *loopNode,ByteCodeLabel loopEntrance,
              ByteCodeLabel continuePastLoop,ByteCodeGenerator *byteCodeGenerator,FuncInfo *funcInfo
              ,BOOL fReturnValue)

{
  ByteCodeWriter *this;
  uint C1;
  code *pcVar1;
  bool bVar2;
  RegSlot RVar3;
  uint loopId;
  undefined4 *puVar4;
  uint uVar5;
  
  if ((loopNode->super_ParseNodeStmt).super_ParseNode.nop != knopForIn) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x264a,"(loopNode->nop == knopForIn)","loopNode->nop == knopForIn");
    if (!bVar2) goto LAB_00821d0b;
    *puVar4 = 0;
  }
  if ((loopNode->super_ParseNodeStmt).super_ParseNode.location != 0xffffffff) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x264b,"(loopNode->location == Js::Constants::NoRegister)",
                       "loopNode->location == Js::Constants::NoRegister");
    if (!bVar2) {
LAB_00821d0b:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  RVar3 = FuncInfo::AcquireTmpRegister(funcInfo);
  loopNode->itemLocation = RVar3;
  C1 = funcInfo->nextForInLoopLevel;
  uVar5 = C1 + 1;
  funcInfo->nextForInLoopLevel = uVar5;
  if (uVar5 < funcInfo->maxForInLoopLevel) {
    uVar5 = funcInfo->maxForInLoopLevel;
  }
  funcInfo->maxForInLoopLevel = uVar5;
  this = &byteCodeGenerator->m_writer;
  Js::ByteCodeWriter::Reg1Unsigned1(this,InitForInEnumerator,loopNode->pnodeObj->location,C1);
  Js::ByteCodeWriter::EndStatement(this,(ParseNode *)loopNode);
  loopId = Js::ByteCodeWriter::EnterLoop(this,loopEntrance);
  ByteCodeGenerator::PushJumpCleanupForLoop(byteCodeGenerator,(ParseNode *)loopNode,loopId);
  ByteCodeGenerator::StartStatement(byteCodeGenerator,loopNode->pnodeLval);
  Js::ByteCodeWriter::BrReg1Unsigned1(this,BrOnEmpty,continuePastLoop,loopNode->itemLocation,C1);
  EmitForInOfLoopBody(loopNode,loopEntrance,continuePastLoop,byteCodeGenerator,funcInfo,fReturnValue
                     );
  DListBase<JumpCleanupInfo,_RealCount>::RemoveHead<Memory::ArenaAllocator>
            (&byteCodeGenerator->jumpCleanupList->super_DListBase<JumpCleanupInfo,_RealCount>,
             byteCodeGenerator->jumpCleanupList->allocator);
  Js::ByteCodeWriter::ExitLoop(this,loopId);
  FuncInfo::ReleaseForInLoopLevel(funcInfo,C1);
  return;
}

Assistant:

void EmitForIn(ParseNodeForInOrForOf *loopNode,
    Js::ByteCodeLabel loopEntrance,
    Js::ByteCodeLabel continuePastLoop,
    ByteCodeGenerator *byteCodeGenerator,
    FuncInfo *funcInfo,
    BOOL fReturnValue)
{
    Assert(loopNode->nop == knopForIn);
    Assert(loopNode->location == Js::Constants::NoRegister);

    // Grab registers for the enumerator and for the current enumerated item.
    // The enumerator register will be released after this call returns.
    loopNode->itemLocation = funcInfo->AcquireTmpRegister();

    uint forInLoopLevel = funcInfo->AcquireForInLoopLevel();

    // get enumerator from the collection
    byteCodeGenerator->Writer()->Reg1Unsigned1(Js::OpCode::InitForInEnumerator, loopNode->pnodeObj->location, forInLoopLevel);

    // The StartStatement is already done in the caller of the current function, which is EmitForInOrForOf
    byteCodeGenerator->EndStatement(loopNode);

    // Need to increment loop count whether we are going into profile or not for HasLoop()
    uint loopId = byteCodeGenerator->Writer()->EnterLoop(loopEntrance);
    byteCodeGenerator->PushJumpCleanupForLoop(loopNode, loopId);

    // The EndStatement will happen in the EmitForInOfLoopBody function
    byteCodeGenerator->StartStatement(loopNode->pnodeLval);

    // branch past loop when MoveAndGetNext returns nullptr
    byteCodeGenerator->Writer()->BrReg1Unsigned1(Js::OpCode::BrOnEmpty, continuePastLoop, loopNode->itemLocation, forInLoopLevel);

    EmitForInOfLoopBody(loopNode, loopEntrance, continuePastLoop, byteCodeGenerator, funcInfo, fReturnValue);

    byteCodeGenerator->PopJumpCleanup();
    byteCodeGenerator->Writer()->ExitLoop(loopId);

    funcInfo->ReleaseForInLoopLevel(forInLoopLevel);
}